

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O0

void xe::writeTestCase(TestCaseResultData *caseData,ostream *stream)

{
  int iVar1;
  TestStatusCode code;
  ostream *poVar2;
  char *pcVar3;
  deUint8 *pdVar4;
  TestStatusCode dataCode;
  deUint8 lastCh;
  ostream *stream_local;
  TestCaseResultData *caseData_local;
  
  poVar2 = std::operator<<(stream,"\n#beginTestCaseResult ");
  pcVar3 = TestCaseResultData::getTestCasePath(caseData);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  iVar1 = TestCaseResultData::getDataSize(caseData);
  if (0 < iVar1) {
    pdVar4 = TestCaseResultData::getData(caseData);
    TestCaseResultData::getDataSize(caseData);
    std::ostream::write((char *)stream,(long)pdVar4);
    pdVar4 = TestCaseResultData::getData(caseData);
    iVar1 = TestCaseResultData::getDataSize(caseData);
    if ((pdVar4[iVar1 + -1] != '\n') && (pdVar4[iVar1 + -1] != '\r')) {
      std::operator<<(stream,"\n");
    }
  }
  code = TestCaseResultData::getStatusCode(caseData);
  if (((code == TESTSTATUSCODE_CRASH) || (code == TESTSTATUSCODE_TIMEOUT)) ||
     (code == TESTSTATUSCODE_TERMINATED)) {
    poVar2 = std::operator<<(stream,"#terminateTestCaseResult ");
    pcVar3 = getTestStatusCodeName(code);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\n");
  }
  else {
    std::operator<<(stream,"#endTestCaseResult\n");
  }
  return;
}

Assistant:

static void writeTestCase (const TestCaseResultData& caseData, std::ostream& stream)
{
	stream << "\n#beginTestCaseResult " << caseData.getTestCasePath() << "\n";

	if (caseData.getDataSize() > 0)
	{
		stream.write((const char*)caseData.getData(), caseData.getDataSize());

		deUint8 lastCh = caseData.getData()[caseData.getDataSize()-1];
		if (lastCh != '\n' && lastCh != '\r')
			stream << "\n";
	}

	TestStatusCode dataCode = caseData.getStatusCode();
	if (dataCode == TESTSTATUSCODE_CRASH	||
		dataCode == TESTSTATUSCODE_TIMEOUT	||
		dataCode == TESTSTATUSCODE_TERMINATED)
		stream << "#terminateTestCaseResult " << getTestStatusCodeName(dataCode) << "\n";
	else
		stream << "#endTestCaseResult\n";
}